

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

uint32_t __thiscall
ymfm::opn_registers_base<true>::lfo_am_offset(opn_registers_base<true> *this,uint32_t choffs)

{
  uint32_t uVar1;
  uint32_t am_shift;
  uint32_t choffs_local;
  opn_registers_base<true> *this_local;
  
  uVar1 = ch_lfo_am_sens(this,choffs);
  return (int)((uint)this->m_lfo_am << 1) >> ((char)(1 << (((byte)uVar1 ^ 3) & 0x1f)) - 1U & 0x1f);
}

Assistant:

uint32_t opn_registers_base<IsOpnA>::lfo_am_offset(uint32_t choffs) const
{
	// shift value for AM sensitivity is [7, 3, 1, 0],
	// mapping to values of [0, 1.4, 5.9, and 11.8dB]
	uint32_t am_shift = (1 << (ch_lfo_am_sens(choffs) ^ 3)) - 1;

	// QUESTION: max sensitivity should give 11.8dB range, but this value
	// is directly added to an x.8 attenuation value, which will only give
	// 126/256 or ~4.9dB range -- what am I missing? The calculation below
	// matches several other emulators, including the Nuked implemenation.

	// raw LFO AM value on OPN is 0-3F, scale that up by a factor of 2
	// (giving 7 bits) before applying the final shift
	return (m_lfo_am << 1) >> am_shift;
}